

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.cpp
# Opt level: O0

bool fs_rename(string_view from,string_view to)

{
  string_view path2;
  string_view path1;
  bool bVar1;
  string_view local_d0;
  error_category *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  path local_90;
  path local_68;
  undefined1 local_40 [8];
  error_code ec;
  string_view to_local;
  string_view from_local;
  
  to_local._M_len = (size_t)to._M_str;
  ec._M_cat = (error_category *)to._M_len;
  to_local._M_str = (char *)from._M_len;
  std::error_code::error_code((error_code *)local_40);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_68,(basic_string_view<char,_std::char_traits<char>_> *)&to_local._M_str,
             auto_format);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_90,(basic_string_view<char,_std::char_traits<char>_> *)&ec._M_cat,auto_format);
  std::filesystem::rename(&local_68,&local_90,(error_code *)local_40);
  std::filesystem::__cxx11::path::~path(&local_90);
  std::filesystem::__cxx11::path::~path(&local_68);
  bVar1 = std::error_code::operator_cast_to_bool((error_code *)local_40);
  if (bVar1) {
    local_b0 = to_local._M_str;
    local_c0 = ec._M_cat;
    local_b8 = (char *)to_local._M_len;
    local_a8 = from._M_str;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_d0,"fs_rename");
    path1._M_str = local_a8;
    path1._M_len = (size_t)local_b0;
    path2._M_str = local_b8;
    path2._M_len = (size_t)local_c0;
    fs_print_error(path1,path2,local_d0,(error_code *)local_40);
  }
  from_local._M_str._7_1_ = !bVar1;
  return from_local._M_str._7_1_;
}

Assistant:

bool
fs_rename(std::string_view from, std::string_view to)
{
  // rename a file or directory
  // existing "to" is overwritten

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  // https://en.cppreference.com/w/cpp/filesystem/rename
  std::filesystem::rename(from, to, ec);
  if(!ec)
#else
  // https://en.cppreference.com/w/cpp/io/c/rename
  if(std::rename(from.data(), to.data()) == 0)
#endif
    return true;

  fs_print_error(from, to, __func__, ec);
  return false;

}